

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall pbrt::TransformedSceneEntity::TransformedSceneEntity(TransformedSceneEntity *this)

{
  AnimatedTransform *in_stack_000000a0;
  SceneEntity *in_stack_fffffffffffffff0;
  
  SceneEntity::SceneEntity(in_stack_fffffffffffffff0);
  AnimatedTransform::AnimatedTransform(in_stack_000000a0);
  return;
}

Assistant:

TransformedSceneEntity() = default;